

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteShadingType1Object
          (ShadingWriter *this,PDFRectangle *inBounds,ObjectIDType inShadingObjectId,
          ObjectIDType *outFunctionObjectId)

{
  EStatusCode EVar1;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  allocator<char> local_51;
  string local_50;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inShadingObjectId);
  this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"ShadingType",&local_51);
  DictionaryContext::WriteKey(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  DictionaryContext::WriteIntegerValue(this_01,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Domain",&local_51);
  DictionaryContext::WriteKey(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->LowerLeftX,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->UpperRightX,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->LowerLeftY,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble(this->mObjectsContext,inBounds->UpperRightY,eTokenSeparatorSpace);
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"ColorSpace",&local_51);
  DictionaryContext::WriteKey(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"DeviceRGB",&local_51);
  DictionaryContext::WriteNameValue(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Function",&local_51);
  DictionaryContext::WriteKey(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  DictionaryContext::WriteNewObjectReferenceValue(this_01,inObjectReference);
  EVar1 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
  if (EVar1 == eSuccess) {
    ObjectsContext::EndIndirectObject(this->mObjectsContext);
  }
  *outFunctionObjectId = inObjectReference;
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteShadingType1Object(const PDFRectangle& inBounds, ObjectIDType inShadingObjectId, ObjectIDType& outFunctionObjectId) {
    ObjectIDType functionObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    mObjectsContext->StartNewIndirectObject(inShadingObjectId);
    DictionaryContext* shadingDict = mObjectsContext->StartDictionary();
    shadingDict->WriteKey("ShadingType");
    shadingDict->WriteIntegerValue(1);
    shadingDict->WriteKey("Domain");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inBounds.LowerLeftX);
    mObjectsContext->WriteDouble(inBounds.UpperRightX);
    mObjectsContext->WriteDouble(inBounds.LowerLeftY);
    mObjectsContext->WriteDouble(inBounds.UpperRightY);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);    
    shadingDict->WriteKey("ColorSpace");
    shadingDict->WriteNameValue("DeviceRGB");
    shadingDict->WriteKey("Function");
    shadingDict->WriteNewObjectReferenceValue(functionObjectId);
    EStatusCode status = mObjectsContext->EndDictionary(shadingDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outFunctionObjectId = functionObjectId;

    return status;
}